

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::BoolOption::giveRndValue(BoolOption *this,string *optionText)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  allocator local_59;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  iVar1 = rand();
  if (iVar1 % 5 < 2) {
    std::__cxx11::string::string((string *)local_58,(this->super_Option).name,&local_59);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1307a0);
  }
  else {
    std::__cxx11::string::string((string *)local_58,(this->super_Option).name,&local_59);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1307a3);
  }
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_28 = *plVar3;
    lStack_20 = plVar2[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar3;
    local_38 = (long *)*plVar2;
  }
  local_30 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)optionText,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        int r = rand();
        if (r % 5 > 1) { // more likely to be enabled
            optionText = "-" + std::string(name);
        } else {
            optionText = "-no-" + std::string(name);
        }
    }